

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

_List_iterator<State> __thiscall
QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::value
          (QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *this,
          _List_iterator<QString> *key,_List_iterator<State> *defaultValue)

{
  bool bVar1;
  pointer ppVar2;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  const_iterator i;
  map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_20;
  _Self local_18;
  _List_node_base *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
                      *)0x123c74);
  if (bVar1) {
    local_18._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
                  *)0x123c9d);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>
         ::find(in_stack_ffffffffffffffb8,(key_type *)0x123cae);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
                  *)0x123cbd);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>
         ::cend(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>
                             *)0x123ced);
      local_10 = (ppVar2->second)._M_node;
    }
    else {
      local_10 = (_List_node_base *)*in_RDX;
    }
  }
  else {
    local_10 = (_List_node_base *)*in_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (_List_iterator<State>)local_10;
  }
  __stack_chk_fail();
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }